

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O1

ArgIface * __thiscall Args::Command::findArgument(Command *this,String *n)

{
  int iVar1;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_38,this);
  if (local_30 == n->_M_string_length) {
    if (local_30 != 0) {
      iVar1 = bcmp(local_38,(n->_M_dataplus)._M_p,local_30);
      if (iVar1 != 0) {
        this = (Command *)0x0;
      }
    }
  }
  else {
    this = (Command *)0x0;
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return (ArgIface *)this;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & n ) override
	{
		if( name() == n )
			return this;
		else
			return nullptr;
	}